

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SWAP.cpp
# Opt level: O0

void test_qclab_qgates_SWAP<std::complex<float>>(void)

{
  allocator<std::complex<float>_> *paVar1;
  complex<float> m31;
  initializer_list<std::complex<float>_> __l;
  initializer_list<std::complex<float>_> __l_00;
  initializer_list<std::complex<float>_> __l_01;
  initializer_list<std::complex<float>_> __l_02;
  initializer_list<std::complex<float>_> __l_03;
  initializer_list<std::complex<float>_> __l_04;
  initializer_list<std::complex<float>_> __l_05;
  initializer_list<std::complex<float>_> __l_06;
  initializer_list<std::complex<float>_> __l_07;
  initializer_list<std::complex<float>_> __l_08;
  bool bVar2;
  char *pcVar3;
  reference pvVar4;
  complex<float> cVar5;
  complex<float> *pcVar6;
  complex<float> m01;
  complex<float> m01_00;
  complex<float> cVar7;
  complex<float> in_R9;
  complex<float> cVar8;
  undefined7 in_stack_ffffffffffffeb48;
  undefined1 in_stack_ffffffffffffeb4f;
  complex<float> in_stack_ffffffffffffeb50;
  complex<float> in_stack_ffffffffffffeb58;
  string local_1350;
  AssertHelper local_1330;
  Message local_1328;
  bool local_1319;
  undefined1 local_1318 [8];
  AssertionResult gtest_ar__21;
  SquareMatrix<std::complex<float>_> mat3_1;
  SquareMatrix<std::complex<float>_> check;
  SWAP<std::complex<float>_> swap_6;
  AssertHelper local_12b8;
  Message local_12b0;
  SquareMatrix<std::complex<float>_> local_12a8;
  SquareMatrix<std::complex<float>_> local_1298;
  bool local_1281;
  undefined1 local_1280 [8];
  AssertionResult gtest_ar__20;
  int qnew_2 [2];
  AssertHelper local_1248;
  Message local_1240;
  SquareMatrix<std::complex<float>_> local_1238;
  SquareMatrix<std::complex<float>_> local_1228;
  bool local_1211;
  undefined1 local_1210 [8];
  AssertionResult gtest_ar__19;
  SquareMatrix<std::complex<float>_> mat3;
  AssertHelper local_11d0;
  Message local_11c8;
  SquareMatrix<std::complex<float>_> local_11c0;
  SquareMatrix<std::complex<float>_> local_11b0;
  bool local_1199;
  undefined1 local_1198 [8];
  AssertionResult gtest_ar__18;
  AssertHelper local_1168;
  Message local_1160;
  SquareMatrix<std::complex<float>_> local_1158;
  SquareMatrix<std::complex<float>_> local_1148;
  SquareMatrix<std::complex<float>_> local_1138;
  bool local_1121;
  undefined1 local_1120 [8];
  AssertionResult gtest_ar__17;
  complex<float> local_1108;
  complex<float> local_1100;
  complex<float> local_10f8;
  complex<float> local_10f0;
  complex<float> local_10e8;
  complex<float> local_10e0;
  complex<float> local_10d8;
  complex<float> local_10d0;
  complex<float> local_10c8;
  complex<float> local_10c0;
  complex<float> local_10b8;
  complex<float> local_10b0;
  complex<float> local_10a8;
  complex<float> local_10a0;
  complex<float> local_1098;
  undefined1 local_1090 [8];
  SquareMatrix<std::complex<float>_> mat;
  AssertHelper local_1060;
  Message local_1058;
  SquareMatrix<std::complex<float>_> local_1050;
  undefined1 local_1039 [9];
  AssertionResult gtest_ar__16;
  SquareMatrix<std::complex<float>_> mat2;
  SWAP<std::complex<float>_> swap_5;
  AssertHelper local_fe8;
  Message local_fe0;
  bool local_fd1;
  undefined1 local_fd0 [8];
  AssertionResult gtest_ar__15;
  complex<float> local_fb8;
  undefined8 uStack_fb0;
  undefined8 local_fa8;
  undefined8 uStack_fa0;
  undefined8 local_f98;
  undefined8 uStack_f90;
  undefined8 local_f88;
  undefined8 uStack_f80;
  iterator local_f70;
  size_type local_f68;
  undefined1 local_f60 [8];
  V check3_1;
  V vec3_1;
  SWAP<std::complex<float>_> swap_4;
  AssertHelper local_f00;
  Message local_ef8;
  bool local_ee9;
  undefined1 local_ee8 [8];
  AssertionResult gtest_ar__14;
  string local_e40;
  AssertHelper local_e20;
  Message local_e18;
  bool local_e09;
  undefined1 local_e08 [8];
  AssertionResult gtest_ar__13;
  string local_d68;
  AssertHelper local_d48;
  Message local_d40;
  bool local_d31;
  undefined1 local_d30 [8];
  AssertionResult gtest_ar__12;
  complex<float> local_d18;
  undefined8 uStack_d10;
  undefined8 local_d08;
  undefined8 uStack_d00;
  undefined8 local_cf8;
  undefined8 uStack_cf0;
  undefined8 local_ce8;
  undefined8 uStack_ce0;
  undefined8 local_cd8;
  undefined8 uStack_cd0;
  undefined8 local_cc8;
  undefined8 uStack_cc0;
  undefined8 local_cb8;
  undefined8 uStack_cb0;
  undefined8 local_ca8;
  undefined8 uStack_ca0;
  iterator local_c90;
  size_type local_c88;
  undefined1 local_c80 [8];
  V check4;
  V vec4;
  AssertHelper local_c30;
  Message local_c28;
  bool local_c19;
  undefined1 local_c18 [8];
  AssertionResult gtest_ar__11;
  int local_bb0 [2];
  int qnew_1 [2];
  AssertHelper local_b88;
  Message local_b80;
  bool local_b71;
  undefined1 local_b70 [8];
  AssertionResult gtest_ar__10;
  complex<float> local_b58;
  undefined8 uStack_b50;
  undefined8 local_b48;
  undefined8 uStack_b40;
  undefined8 local_b38;
  undefined8 uStack_b30;
  undefined8 local_b28;
  undefined8 uStack_b20;
  iterator local_b18;
  size_type local_b10;
  undefined1 local_b08 [8];
  V check3;
  V vec3;
  AssertHelper local_ab8;
  Message local_ab0;
  bool local_aa1;
  undefined1 local_aa0 [8];
  AssertionResult gtest_ar__9;
  complex<float> local_a88;
  undefined8 uStack_a80;
  undefined8 local_a78;
  undefined8 uStack_a70;
  iterator local_a60;
  size_type local_a58;
  undefined1 local_a50 [8];
  V check2;
  V vec2;
  SWAP<std::complex<float>_> swap_3;
  Message local_a08;
  int local_9fc;
  vector<int,_std::allocator<int>_> local_9f8;
  undefined1 local_9e0 [8];
  AssertionResult gtest_ar_14;
  Message local_9c8;
  int local_9bc;
  vector<int,_std::allocator<int>_> local_9b8;
  undefined1 local_9a0 [8];
  AssertionResult gtest_ar_13;
  AssertHelper local_970;
  Message local_968;
  bool local_959;
  undefined1 local_958 [8];
  AssertionResult gtest_ar__8;
  AssertHelper local_928;
  Message local_920;
  bool local_911;
  undefined1 local_910 [8];
  AssertionResult gtest_ar__7;
  Message local_8f8;
  int local_8f0;
  int local_8ec;
  undefined1 local_8e8 [8];
  AssertionResult gtest_ar_12;
  SWAP<std::complex<float>_> swap_2;
  int qubits_1 [2];
  Message local_8b8;
  int local_8ac;
  vector<int,_std::allocator<int>_> local_8a8;
  undefined1 local_890 [8];
  AssertionResult gtest_ar_11;
  Message local_878;
  int local_86c;
  vector<int,_std::allocator<int>_> local_868;
  undefined1 local_850 [8];
  AssertionResult gtest_ar_10;
  AssertHelper local_820;
  Message local_818;
  bool local_809;
  undefined1 local_808 [8];
  AssertionResult gtest_ar__6;
  AssertHelper local_7d8;
  Message local_7d0;
  bool local_7c1;
  undefined1 local_7c0 [8];
  AssertionResult gtest_ar__5;
  Message local_7a8;
  int local_7a0;
  int local_79c;
  undefined1 local_798 [8];
  AssertionResult gtest_ar_9;
  SWAP<std::complex<float>_> swap_1;
  AssertHelper local_758;
  Message local_750;
  bool local_741;
  undefined1 local_740 [8];
  AssertionResult gtest_ar__4;
  AssertHelper local_710;
  Message local_708;
  bool local_6f9;
  undefined1 local_6f8 [8];
  AssertionResult gtest_ar__3;
  SWAP<std::complex<float>_> swap2;
  AssertHelper local_6b8;
  Message local_6b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6a8;
  undefined1 local_688 [8];
  AssertionResult gtest_ar_8;
  Message local_670;
  int local_668;
  int local_664;
  undefined1 local_660 [8];
  AssertionResult gtest_ar_7;
  stringstream qasm;
  ostream local_640 [376];
  string local_4c8;
  AssertHelper local_4a8;
  Message local_4a0;
  SquareMatrix<std::complex<float>_> local_498;
  bool local_481;
  undefined1 local_480 [8];
  AssertionResult gtest_ar__2;
  complex<float> local_468;
  complex<float> local_460;
  complex<float> local_458;
  complex<float> local_450;
  complex<float> local_448;
  complex<float> local_440;
  complex<float> local_438;
  complex<float> local_430;
  complex<float> local_428;
  complex<float> local_420;
  complex<float> local_418;
  complex<float> local_410;
  complex<float> local_408;
  complex<float> local_400;
  complex<float> local_3f8;
  undefined1 local_3f0 [8];
  SquareMatrix<std::complex<float>_> SWAP_check;
  Message local_3d8;
  int local_3cc;
  vector<int,_std::allocator<int>_> local_3c8;
  undefined1 local_3b0 [8];
  AssertionResult gtest_ar_6;
  Message local_398;
  int local_38c;
  vector<int,_std::allocator<int>_> local_388;
  undefined1 local_370 [8];
  AssertionResult gtest_ar_5;
  int qnew [2];
  Message local_350;
  int local_344;
  undefined1 local_340 [8];
  AssertionResult gtest_ar_4;
  Message local_328;
  int local_31c;
  undefined1 local_318 [8];
  AssertionResult gtest_ar_3;
  Message local_300;
  int local_2f4;
  size_type local_2f0;
  undefined1 local_2e8 [8];
  AssertionResult gtest_ar_2;
  vector<int,_std::allocator<int>_> qubits;
  Message local_2b8;
  int local_2b0;
  int local_2ac;
  undefined1 local_2a8 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_278;
  Message local_270;
  bool local_261;
  undefined1 local_260 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_230;
  Message local_228;
  bool local_219;
  undefined1 local_218 [8];
  AssertionResult gtest_ar_;
  Message local_200;
  int local_1f8;
  int local_1f4;
  undefined1 local_1f0 [8];
  AssertionResult gtest_ar;
  SWAP<std::complex<float>_> swap;
  complex<float> local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  iterator local_148;
  size_type local_140;
  undefined1 local_138 [8];
  V v4;
  complex<float> local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  iterator local_d8;
  size_type local_d0;
  undefined1 local_c8 [8];
  V v3;
  complex<float> local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  iterator local_80;
  size_type local_78;
  undefined1 local_70 [8];
  V v2;
  SquareMatrix<std::complex<float>_> I4;
  SquareMatrix<std::complex<float>_> I3;
  undefined1 local_28 [8];
  SquareMatrix<std::complex<float>_> I2;
  SquareMatrix<std::complex<float>_> I1;
  
  qclab::dense::eye<std::complex<float>>((dense *)&I2.data_,2);
  qclab::dense::eye<std::complex<float>>((dense *)local_28,4);
  qclab::dense::eye<std::complex<float>>((dense *)&I4.data_,8);
  qclab::dense::eye<std::complex<float>>
            ((dense *)&v2.
                       super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,0x10);
  local_98 = 0x40000000;
  uStack_90 = 0x40e00000;
  local_a8._M_value = 0x40400000;
  uStack_a0 = 0x40a00000;
  local_80 = &local_a8;
  local_78 = 4;
  paVar1 = (allocator<std::complex<float>_> *)
           ((long)&v3.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<std::complex<float>_>::allocator(paVar1);
  __l_08._M_len = local_78;
  __l_08._M_array = local_80;
  std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::vector
            ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)local_70,__l_08,
             paVar1);
  std::allocator<std::complex<float>_>::~allocator
            ((allocator<std::complex<float>_> *)
             ((long)&v3.
                     super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  local_e8 = 0x41000000;
  uStack_e0 = 0x40400000;
  local_f8 = 0x40800000;
  uStack_f0 = 0x3f800000;
  local_108 = 0x40000000;
  uStack_100 = 0x40e00000;
  local_118._M_value = 0x40400000;
  uStack_110 = 0x40a00000;
  local_d8 = &local_118;
  local_d0 = 8;
  paVar1 = (allocator<std::complex<float>_> *)
           ((long)&v4.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<std::complex<float>_>::allocator(paVar1);
  __l_07._M_len = local_d0;
  __l_07._M_array = local_d8;
  std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::vector
            ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)local_c8,__l_07,
             paVar1);
  std::allocator<std::complex<float>_>::~allocator
            ((allocator<std::complex<float>_> *)
             ((long)&v4.
                     super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  local_158 = 0x40a00000;
  uStack_150 = 0x3f800000;
  local_168 = 0x41000000;
  uStack_160 = 0x41100000;
  local_178 = 0x40a00000;
  uStack_170 = 0x40c00000;
  local_188 = 0x40e00000;
  uStack_180 = 0x40000000;
  local_198 = 0x41000000;
  uStack_190 = 0x40400000;
  local_1a8 = 0x40800000;
  uStack_1a0 = 0x3f800000;
  local_1b8 = 0x40000000;
  uStack_1b0 = 0x40e00000;
  local_1c8._M_value = 0x40400000;
  uStack_1c0 = 0x40a00000;
  local_148 = &local_1c8;
  local_140 = 0x10;
  paVar1 = (allocator<std::complex<float>_> *)((long)swap.qubits_._M_elems + 7);
  std::allocator<std::complex<float>_>::allocator(paVar1);
  __l_06._M_len = local_140;
  __l_06._M_array = local_148;
  std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::vector
            ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)local_138,__l_06,
             paVar1);
  std::allocator<std::complex<float>_>::~allocator
            ((allocator<std::complex<float>_> *)((long)swap.qubits_._M_elems + 7));
  qclab::qgates::SWAP<std::complex<float>_>::SWAP((SWAP<std::complex<float>_> *)&gtest_ar.message_);
  local_1f4 = qclab::qgates::QGate2<std::complex<float>_>::nbQubits
                        ((QGate2<std::complex<float>_> *)&gtest_ar.message_);
  local_1f8 = 2;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_1f0,"swap.nbQubits()","2",&local_1f4,&local_1f8);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1f0);
  if (!bVar2) {
    testing::Message::Message(&local_200);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1f0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x15,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,&local_200);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    testing::Message::~Message(&local_200);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1f0);
  local_219 = qclab::qgates::SWAP<std::complex<float>_>::fixed
                        ((SWAP<std::complex<float>_> *)&gtest_ar.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_218,&local_219,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_218);
  if (!bVar2) {
    testing::Message::Message(&local_228);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__1.message_,(internal *)local_218,(AssertionResult *)0x693043,
               "false","true",(char *)in_R9._M_value);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_230,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x16,pcVar3);
    testing::internal::AssertHelper::operator=(&local_230,&local_228);
    testing::internal::AssertHelper::~AssertHelper(&local_230);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(&local_228);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_218);
  bVar2 = qclab::qgates::SWAP<std::complex<float>_>::controlled
                    ((SWAP<std::complex<float>_> *)&gtest_ar.message_);
  local_261 = (bool)(~bVar2 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_260,&local_261,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_260);
  if (!bVar2) {
    testing::Message::Message(&local_270);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_1.message_,(internal *)local_260,(AssertionResult *)0x693051,
               "true","false",(char *)in_R9._M_value);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_278,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x17,pcVar3);
    testing::internal::AssertHelper::operator=(&local_278,&local_270);
    testing::internal::AssertHelper::~AssertHelper(&local_278);
    std::__cxx11::string::~string((string *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_270);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_260);
  local_2ac = qclab::qgates::SWAP<std::complex<float>_>::qubit
                        ((SWAP<std::complex<float>_> *)&gtest_ar.message_);
  local_2b0 = 0;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_2a8,"swap.qubit()","0",&local_2ac,&local_2b0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2a8);
  if (!bVar2) {
    testing::Message::Message(&local_2b8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_2a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                ._M_end_of_storage,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x1a,pcVar3);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                ._M_end_of_storage,&local_2b8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                ._M_end_of_storage);
    testing::Message::~Message(&local_2b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2a8);
  qclab::qgates::SWAP<std::complex<float>_>::qubits
            ((vector<int,_std::allocator<int>_> *)&gtest_ar_2.message_,
             (SWAP<std::complex<float>_> *)&gtest_ar.message_);
  local_2f0 = std::vector<int,_std::allocator<int>_>::size
                        ((vector<int,_std::allocator<int>_> *)&gtest_ar_2.message_);
  local_2f4 = 2;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_2e8,"qubits.size()","2",&local_2f0,&local_2f4);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2e8);
  if (!bVar2) {
    testing::Message::Message(&local_300);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_2e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x1e,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_300);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_300);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2e8);
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)&gtest_ar_2.message_,0);
  local_31c = 0;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_318,"qubits[0]","0",pvVar4,&local_31c);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_318);
  if (!bVar2) {
    testing::Message::Message(&local_328);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_318);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x1f,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_328);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_328);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_318);
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)&gtest_ar_2.message_,1);
  local_344 = 1;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_340,"qubits[1]","1",pvVar4,&local_344);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_340);
  if (!bVar2) {
    testing::Message::Message(&local_350);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_340);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)qnew,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x20,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)qnew,&local_350);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)qnew);
    testing::Message::~Message(&local_350);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_340);
  gtest_ar_5.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x500000003;
  qclab::qgates::SWAP<std::complex<float>_>::setQubits
            ((SWAP<std::complex<float>_> *)&gtest_ar.message_,(int *)&gtest_ar_5.message_);
  qclab::qgates::SWAP<std::complex<float>_>::qubits
            (&local_388,(SWAP<std::complex<float>_> *)&gtest_ar.message_);
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&local_388,0);
  local_38c = 3;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_370,"swap.qubits()[0]","3",pvVar4,&local_38c);
  std::vector<int,_std::allocator<int>_>::~vector(&local_388);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_370);
  if (!bVar2) {
    testing::Message::Message(&local_398);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_370);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x23,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_398);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_398);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_370);
  qclab::qgates::SWAP<std::complex<float>_>::qubits
            (&local_3c8,(SWAP<std::complex<float>_> *)&gtest_ar.message_);
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&local_3c8,1);
  local_3cc = 5;
  cVar5._M_value = (_ComplexT)&local_3cc;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_3b0,"swap.qubits()[1]","5",pvVar4,(int *)cVar5._M_value);
  std::vector<int,_std::allocator<int>_>::~vector(&local_3c8);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3b0);
  if (!bVar2) {
    testing::Message::Message(&local_3d8);
    cVar5._M_value =
         (_ComplexT)testing::AssertionResult::failure_message((AssertionResult *)local_3b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&SWAP_check.data_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x24,(char *)cVar5._M_value);
    testing::internal::AssertHelper::operator=((AssertHelper *)&SWAP_check.data_,&local_3d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&SWAP_check.data_);
    testing::Message::~Message(&local_3d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3b0);
  gtest_ar_5.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x100000000;
  cVar7._M_value = (_ComplexT)&gtest_ar_5.message_;
  qclab::qgates::SWAP<std::complex<float>_>::setQubits
            ((SWAP<std::complex<float>_> *)&gtest_ar.message_,(int *)cVar7._M_value);
  std::complex<float>::complex(&local_3f8,1.0,0.0);
  std::complex<float>::complex(&local_400,0.0,0.0);
  std::complex<float>::complex(&local_408,0.0,0.0);
  std::complex<float>::complex(&local_410,0.0,0.0);
  std::complex<float>::complex(&local_418,0.0,0.0);
  std::complex<float>::complex(&local_420,0.0,0.0);
  std::complex<float>::complex(&local_428,1.0,0.0);
  std::complex<float>::complex(&local_430,0.0,0.0);
  std::complex<float>::complex(&local_438,0.0,0.0);
  std::complex<float>::complex(&local_440,1.0,0.0);
  std::complex<float>::complex(&local_448,0.0,0.0);
  std::complex<float>::complex(&local_450,0.0,0.0);
  std::complex<float>::complex(&local_458,0.0,0.0);
  std::complex<float>::complex(&local_460,0.0,0.0);
  std::complex<float>::complex(&local_468,0.0,0.0);
  std::complex<float>::complex((complex<float> *)&gtest_ar__2.message_,1.0,0.0);
  cVar8._M_value._7_1_ = in_stack_ffffffffffffeb4f;
  cVar8._M_value._0_7_ = in_stack_ffffffffffffeb48;
  qclab::dense::SquareMatrix<std::complex<float>_>::SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)local_3f0,cVar7,m01,local_438,cVar5,in_R9,
             local_438,local_440,local_448,local_450,local_458,local_460,local_468,
             (complex<float>)
             gtest_ar__2.message_._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl,cVar8,in_stack_ffffffffffffeb50,in_stack_ffffffffffffeb58);
  qclab::qgates::SWAP<std::complex<float>_>::matrix((SWAP<std::complex<float>_> *)&local_498);
  local_481 = qclab::dense::SquareMatrix<std::complex<float>_>::operator==
                        (&local_498,(SquareMatrix<std::complex<float>_> *)local_3f0);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_480,&local_481,(type *)0x0);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix(&local_498);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_480);
  if (!bVar2) {
    testing::Message::Message(&local_4a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_4c8,(internal *)local_480,(AssertionResult *)"swap.matrix() == SWAP_check",
               "false","true",(char *)in_R9._M_value);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_4a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x2e,pcVar3);
    testing::internal::AssertHelper::operator=(&local_4a8,&local_4a0);
    testing::internal::AssertHelper::~AssertHelper(&local_4a8);
    std::__cxx11::string::~string((string *)&local_4c8);
    testing::Message::~Message(&local_4a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_480);
  qclab::qgates::QGate2<std::complex<float>_>::print
            ((QGate2<std::complex<float>_> *)&gtest_ar.message_);
  std::__cxx11::stringstream::stringstream((stringstream *)&gtest_ar_7.message_);
  local_664 = qclab::qgates::SWAP<std::complex<float>_>::toQASM
                        ((SWAP<std::complex<float>_> *)&gtest_ar.message_,local_640,0);
  local_668 = 0;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_660,"swap.toQASM( qasm )","0",&local_664,&local_668);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_660);
  if (!bVar2) {
    testing::Message::Message(&local_670);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_660);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x35,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,&local_670);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
    testing::Message::~Message(&local_670);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_660);
  std::__cxx11::stringstream::str();
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[18],_nullptr>
            ((EqHelper *)local_688,"qasm.str()","\"swap q[0], q[1];\\n\"",&local_6a8,
             (char (*) [18])0x6930df);
  std::__cxx11::string::~string((string *)&local_6a8);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_688);
  if (!bVar2) {
    testing::Message::Message(&local_6b0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_688);
    testing::internal::AssertHelper::AssertHelper
              (&local_6b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x36,pcVar3);
    testing::internal::AssertHelper::operator=(&local_6b8,&local_6b0);
    testing::internal::AssertHelper::~AssertHelper(&local_6b8);
    testing::Message::~Message(&local_6b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_688);
  std::__cxx11::stringstream::str();
  std::operator<<((ostream *)&std::cout,(string *)&swap2.qubits_);
  std::__cxx11::string::~string((string *)&swap2.qubits_);
  qclab::qgates::SWAP<std::complex<float>_>::SWAP
            ((SWAP<std::complex<float>_> *)&gtest_ar__3.message_,2,4);
  local_6f9 = qclab::QObject<std::complex<float>_>::operator==
                        ((QObject<std::complex<float>_> *)&gtest_ar.message_,
                         (QObject<std::complex<float>_> *)&gtest_ar__3.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_6f8,&local_6f9,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6f8);
  if (!bVar2) {
    testing::Message::Message(&local_708);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__4.message_,(internal *)local_6f8,
               (AssertionResult *)"swap == swap2","false","true",(char *)in_R9._M_value);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_710,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x3b,pcVar3);
    testing::internal::AssertHelper::operator=(&local_710,&local_708);
    testing::internal::AssertHelper::~AssertHelper(&local_710);
    std::__cxx11::string::~string((string *)&gtest_ar__4.message_);
    testing::Message::~Message(&local_708);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_6f8);
  bVar2 = qclab::QObject<std::complex<float>_>::operator!=
                    ((QObject<std::complex<float>_> *)&gtest_ar.message_,
                     (QObject<std::complex<float>_> *)&gtest_ar__3.message_);
  local_741 = (bool)(~bVar2 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_740,&local_741,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_740);
  if (!bVar2) {
    testing::Message::Message(&local_750);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&swap_1.qubits_,(internal *)local_740,(AssertionResult *)"swap != swap2",
               "true","false",(char *)in_R9._M_value);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_758,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x3c,pcVar3);
    testing::internal::AssertHelper::operator=(&local_758,&local_750);
    testing::internal::AssertHelper::~AssertHelper(&local_758);
    std::__cxx11::string::~string((string *)&swap_1.qubits_);
    testing::Message::~Message(&local_750);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_740);
  qclab::qgates::SWAP<std::complex<float>_>::~SWAP
            ((SWAP<std::complex<float>_> *)&gtest_ar__3.message_);
  std::__cxx11::stringstream::~stringstream((stringstream *)&gtest_ar_7.message_);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)local_3f0);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)&gtest_ar_2.message_);
  qclab::qgates::SWAP<std::complex<float>_>::~SWAP((SWAP<std::complex<float>_> *)&gtest_ar.message_)
  ;
  qclab::qgates::SWAP<std::complex<float>_>::SWAP
            ((SWAP<std::complex<float>_> *)&gtest_ar_9.message_,3,5);
  local_79c = qclab::qgates::QGate2<std::complex<float>_>::nbQubits
                        ((QGate2<std::complex<float>_> *)&gtest_ar_9.message_);
  local_7a0 = 2;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_798,"swap.nbQubits()","2",&local_79c,&local_7a0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_798);
  if (!bVar2) {
    testing::Message::Message(&local_7a8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_798);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x42,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__5.message_,&local_7a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__5.message_);
    testing::Message::~Message(&local_7a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_798);
  local_7c1 = qclab::qgates::SWAP<std::complex<float>_>::fixed
                        ((SWAP<std::complex<float>_> *)&gtest_ar_9.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_7c0,&local_7c1,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7c0);
  if (!bVar2) {
    testing::Message::Message(&local_7d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__6.message_,(internal *)local_7c0,(AssertionResult *)0x693043,
               "false","true",(char *)in_R9._M_value);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_7d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x43,pcVar3);
    testing::internal::AssertHelper::operator=(&local_7d8,&local_7d0);
    testing::internal::AssertHelper::~AssertHelper(&local_7d8);
    std::__cxx11::string::~string((string *)&gtest_ar__6.message_);
    testing::Message::~Message(&local_7d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_7c0);
  bVar2 = qclab::qgates::SWAP<std::complex<float>_>::controlled
                    ((SWAP<std::complex<float>_> *)&gtest_ar_9.message_);
  local_809 = (bool)(~bVar2 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_808,&local_809,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_808);
  if (!bVar2) {
    testing::Message::Message(&local_818);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_10.message_,(internal *)local_808,(AssertionResult *)0x693051,
               "true","false",(char *)in_R9._M_value);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_820,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x44,pcVar3);
    testing::internal::AssertHelper::operator=(&local_820,&local_818);
    testing::internal::AssertHelper::~AssertHelper(&local_820);
    std::__cxx11::string::~string((string *)&gtest_ar_10.message_);
    testing::Message::~Message(&local_818);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_808);
  qclab::qgates::SWAP<std::complex<float>_>::qubits
            (&local_868,(SWAP<std::complex<float>_> *)&gtest_ar_9.message_);
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&local_868,0);
  local_86c = 3;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_850,"swap.qubits()[0]","3",pvVar4,&local_86c);
  std::vector<int,_std::allocator<int>_>::~vector(&local_868);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_850);
  if (!bVar2) {
    testing::Message::Message(&local_878);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_850);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_11.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x45,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_11.message_,&local_878);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11.message_);
    testing::Message::~Message(&local_878);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_850);
  qclab::qgates::SWAP<std::complex<float>_>::qubits
            (&local_8a8,(SWAP<std::complex<float>_> *)&gtest_ar_9.message_);
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&local_8a8,1);
  local_8ac = 5;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_890,"swap.qubits()[1]","5",pvVar4,&local_8ac);
  std::vector<int,_std::allocator<int>_>::~vector(&local_8a8);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_890);
  if (!bVar2) {
    testing::Message::Message(&local_8b8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_890);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)qubits_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x46,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)qubits_1,&local_8b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)qubits_1);
    testing::Message::~Message(&local_8b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_890);
  qclab::qgates::SWAP<std::complex<float>_>::~SWAP
            ((SWAP<std::complex<float>_> *)&gtest_ar_9.message_);
  swap_2.qubits_._M_elems[0] = 3;
  swap_2.qubits_._M_elems[1] = 5;
  qclab::qgates::SWAP<std::complex<float>_>::SWAP
            ((SWAP<std::complex<float>_> *)&gtest_ar_12.message_,swap_2.qubits_._M_elems);
  local_8ec = qclab::qgates::QGate2<std::complex<float>_>::nbQubits
                        ((QGate2<std::complex<float>_> *)&gtest_ar_12.message_);
  local_8f0 = 2;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_8e8,"swap.nbQubits()","2",&local_8ec,&local_8f0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_8e8);
  if (!bVar2) {
    testing::Message::Message(&local_8f8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_8e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x4d,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__7.message_,&local_8f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__7.message_);
    testing::Message::~Message(&local_8f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_8e8);
  local_911 = qclab::qgates::SWAP<std::complex<float>_>::fixed
                        ((SWAP<std::complex<float>_> *)&gtest_ar_12.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_910,&local_911,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_910);
  if (!bVar2) {
    testing::Message::Message(&local_920);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__8.message_,(internal *)local_910,(AssertionResult *)0x693043,
               "false","true",(char *)in_R9._M_value);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_928,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x4e,pcVar3);
    testing::internal::AssertHelper::operator=(&local_928,&local_920);
    testing::internal::AssertHelper::~AssertHelper(&local_928);
    std::__cxx11::string::~string((string *)&gtest_ar__8.message_);
    testing::Message::~Message(&local_920);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_910);
  bVar2 = qclab::qgates::SWAP<std::complex<float>_>::controlled
                    ((SWAP<std::complex<float>_> *)&gtest_ar_12.message_);
  local_959 = (bool)(~bVar2 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_958,&local_959,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_958);
  if (!bVar2) {
    testing::Message::Message(&local_968);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_13.message_,(internal *)local_958,(AssertionResult *)0x693051,
               "true","false",(char *)in_R9._M_value);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_970,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x4f,pcVar3);
    testing::internal::AssertHelper::operator=(&local_970,&local_968);
    testing::internal::AssertHelper::~AssertHelper(&local_970);
    std::__cxx11::string::~string((string *)&gtest_ar_13.message_);
    testing::Message::~Message(&local_968);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_958);
  qclab::qgates::SWAP<std::complex<float>_>::qubits
            (&local_9b8,(SWAP<std::complex<float>_> *)&gtest_ar_12.message_);
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&local_9b8,0);
  local_9bc = 3;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_9a0,"swap.qubits()[0]","3",pvVar4,&local_9bc);
  std::vector<int,_std::allocator<int>_>::~vector(&local_9b8);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_9a0);
  if (!bVar2) {
    testing::Message::Message(&local_9c8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_9a0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_14.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x50,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_14.message_,&local_9c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_14.message_);
    testing::Message::~Message(&local_9c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_9a0);
  qclab::qgates::SWAP<std::complex<float>_>::qubits
            (&local_9f8,(SWAP<std::complex<float>_> *)&gtest_ar_12.message_);
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&local_9f8,1);
  local_9fc = 5;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_9e0,"swap.qubits()[1]","5",pvVar4,&local_9fc);
  std::vector<int,_std::allocator<int>_>::~vector(&local_9f8);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_9e0);
  if (!bVar2) {
    testing::Message::Message(&local_a08);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_9e0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&swap_3.qubits_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x51,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&swap_3.qubits_,&local_a08);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&swap_3.qubits_);
    testing::Message::~Message(&local_a08);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_9e0);
  qclab::qgates::SWAP<std::complex<float>_>::~SWAP
            ((SWAP<std::complex<float>_> *)&gtest_ar_12.message_);
  qclab::qgates::SWAP<std::complex<float>_>::SWAP
            ((SWAP<std::complex<float>_> *)
             &vec2.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,0,1);
  std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::vector
            ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)
             &check2.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)local_70);
  qclab::qgates::SWAP<std::complex<float>_>::apply
            ((SWAP<std::complex<float>_> *)
             &vec2.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,NoTrans,2,
             (vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)
             &check2.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,0);
  local_a78 = 0x40a00000;
  uStack_a70 = 0x40e00000;
  local_a88._M_value = 0x40400000;
  uStack_a80 = 0x40000000;
  local_a60 = &local_a88;
  local_a58 = 4;
  paVar1 = (allocator<std::complex<float>_> *)
           ((long)&gtest_ar__9.message_._M_t.
                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           + 7);
  std::allocator<std::complex<float>_>::allocator(paVar1);
  __l_05._M_len = local_a58;
  __l_05._M_array = local_a60;
  std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::vector
            ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)local_a50,__l_05,
             paVar1);
  std::allocator<std::complex<float>_>::~allocator
            ((allocator<std::complex<float>_> *)
             ((long)&gtest_ar__9.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  local_aa1 = std::operator==((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)
                              &check2.
                               super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,
                              (vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)
                              local_a50);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_aa0,&local_aa1,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_aa0);
  if (!bVar2) {
    testing::Message::Message(&local_ab0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)
               &vec3.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,(internal *)local_aa0,
               (AssertionResult *)"vec2 == check2","false","true",(char *)in_R9._M_value);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_ab8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x5b,pcVar3);
    testing::internal::AssertHelper::operator=(&local_ab8,&local_ab0);
    testing::internal::AssertHelper::~AssertHelper(&local_ab8);
    std::__cxx11::string::~string
              ((string *)
               &vec3.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    testing::Message::~Message(&local_ab0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_aa0);
  std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::vector
            ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)
             &check3.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)local_c8);
  qclab::qgates::SWAP<std::complex<float>_>::apply
            ((SWAP<std::complex<float>_> *)
             &vec2.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,NoTrans,3,
             (vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)
             &check3.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,0);
  local_b28 = 0x41000000;
  uStack_b20 = 0x40400000;
  local_b38 = 0x40000000;
  uStack_b30 = 0x40e00000;
  local_b48 = 0x40800000;
  uStack_b40 = 0x3f800000;
  local_b58._M_value = 0x40400000;
  uStack_b50 = 0x40a00000;
  local_b18 = &local_b58;
  local_b10 = 8;
  paVar1 = (allocator<std::complex<float>_> *)
           ((long)&gtest_ar__10.message_._M_t.
                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           + 7);
  std::allocator<std::complex<float>_>::allocator(paVar1);
  __l_04._M_len = local_b10;
  __l_04._M_array = local_b18;
  std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::vector
            ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)local_b08,__l_04,
             paVar1);
  std::allocator<std::complex<float>_>::~allocator
            ((allocator<std::complex<float>_> *)
             ((long)&gtest_ar__10.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  local_b71 = std::operator==((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)
                              &check3.
                               super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,
                              (vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)
                              local_b08);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_b70,&local_b71,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b70);
  if (!bVar2) {
    testing::Message::Message(&local_b80);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)qnew_1,(internal *)local_b70,(AssertionResult *)"vec3 == check3","false",
               "true",(char *)in_R9._M_value);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_b88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x67,pcVar3);
    testing::internal::AssertHelper::operator=(&local_b88,&local_b80);
    testing::internal::AssertHelper::~AssertHelper(&local_b88);
    std::__cxx11::string::~string((string *)qnew_1);
    testing::Message::~Message(&local_b80);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b70);
  local_bb0[0] = 1;
  local_bb0[1] = 2;
  qclab::qgates::SWAP<std::complex<float>_>::setQubits
            ((SWAP<std::complex<float>_> *)
             &vec2.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,local_bb0);
  std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::operator=
            ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)
             &check3.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)local_c8);
  qclab::qgates::SWAP<std::complex<float>_>::apply
            ((SWAP<std::complex<float>_> *)
             &vec2.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,NoTrans,3,
             (vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)
             &check3.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,0);
  gtest_ar__11.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x40400000;
  __l_03._M_len = 8;
  __l_03._M_array = (iterator)&gtest_ar__11.message_;
  std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::operator=
            ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)local_b08,__l_03)
  ;
  local_c19 = std::operator==((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)
                              &check3.
                               super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,
                              (vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)
                              local_b08);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_c18,&local_c19,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c18);
  if (!bVar2) {
    testing::Message::Message(&local_c28);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)
               &vec4.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,(internal *)local_c18,
               (AssertionResult *)"vec3 == check3","false","true",(char *)in_R9._M_value);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_c30,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x74,pcVar3);
    testing::internal::AssertHelper::operator=(&local_c30,&local_c28);
    testing::internal::AssertHelper::~AssertHelper(&local_c30);
    std::__cxx11::string::~string
              ((string *)
               &vec4.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    testing::Message::~Message(&local_c28);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c18);
  std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::vector
            ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)
             &check4.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)local_138);
  qclab::qgates::SWAP<std::complex<float>_>::apply
            ((SWAP<std::complex<float>_> *)
             &vec2.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,NoTrans,4,
             (vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)
             &check4.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,0);
  local_ca8 = 0x40a00000;
  uStack_ca0 = 0x3f800000;
  local_cb8 = 0x40a00000;
  uStack_cb0 = 0x40c00000;
  local_cc8 = 0x41000000;
  uStack_cc0 = 0x41100000;
  local_cd8 = 0x40e00000;
  uStack_cd0 = 0x40000000;
  local_ce8 = 0x41000000;
  uStack_ce0 = 0x40400000;
  local_cf8 = 0x40000000;
  uStack_cf0 = 0x40e00000;
  local_d08 = 0x40800000;
  uStack_d00 = 0x3f800000;
  local_d18._M_value = 0x40400000;
  uStack_d10 = 0x40a00000;
  local_c90 = &local_d18;
  local_c88 = 0x10;
  paVar1 = (allocator<std::complex<float>_> *)
           ((long)&gtest_ar__12.message_._M_t.
                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           + 7);
  std::allocator<std::complex<float>_>::allocator(paVar1);
  __l_02._M_len = local_c88;
  __l_02._M_array = local_c90;
  std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::vector
            ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)local_c80,__l_02,
             paVar1);
  std::allocator<std::complex<float>_>::~allocator
            ((allocator<std::complex<float>_> *)
             ((long)&gtest_ar__12.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  local_d31 = std::operator==((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)
                              &check4.
                               super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,
                              (vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)
                              local_c80);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_d30,&local_d31,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d30);
  if (!bVar2) {
    testing::Message::Message(&local_d40);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_d68,(internal *)local_d30,(AssertionResult *)"vec4 == check4","false","true",
               (char *)in_R9._M_value);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_d48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x80,pcVar3);
    testing::internal::AssertHelper::operator=(&local_d48,&local_d40);
    testing::internal::AssertHelper::~AssertHelper(&local_d48);
    std::__cxx11::string::~string((string *)&local_d68);
    testing::Message::~Message(&local_d40);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d30);
  local_bb0[0] = 0;
  local_bb0[1] = 1;
  qclab::qgates::SWAP<std::complex<float>_>::setQubits
            ((SWAP<std::complex<float>_> *)
             &vec2.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,local_bb0);
  std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::operator=
            ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)
             &check4.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)local_138);
  qclab::qgates::SWAP<std::complex<float>_>::apply
            ((SWAP<std::complex<float>_> *)
             &vec2.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,NoTrans,4,
             (vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)
             &check4.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,0);
  gtest_ar__13.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x40400000;
  __l_01._M_len = 0x10;
  __l_01._M_array = (iterator)&gtest_ar__13.message_;
  std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::operator=
            ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)local_c80,__l_01)
  ;
  local_e09 = std::operator==((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)
                              &check4.
                               super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,
                              (vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)
                              local_c80);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_e08,&local_e09,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e08);
  if (!bVar2) {
    testing::Message::Message(&local_e18);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_e40,(internal *)local_e08,(AssertionResult *)"vec4 == check4","false","true",
               (char *)in_R9._M_value);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_e20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x8e,pcVar3);
    testing::internal::AssertHelper::operator=(&local_e20,&local_e18);
    testing::internal::AssertHelper::~AssertHelper(&local_e20);
    std::__cxx11::string::~string((string *)&local_e40);
    testing::Message::~Message(&local_e18);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e08);
  local_bb0[0] = 2;
  local_bb0[1] = 3;
  qclab::qgates::SWAP<std::complex<float>_>::setQubits
            ((SWAP<std::complex<float>_> *)
             &vec2.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,local_bb0);
  std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::operator=
            ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)
             &check4.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)local_138);
  qclab::qgates::SWAP<std::complex<float>_>::apply
            ((SWAP<std::complex<float>_> *)
             &vec2.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,NoTrans,4,
             (vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)
             &check4.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,0);
  gtest_ar__14.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x40400000;
  __l_00._M_len = 0x10;
  __l_00._M_array = (iterator)&gtest_ar__14.message_;
  std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::operator=
            ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)local_c80,__l_00)
  ;
  local_ee9 = std::operator==((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)
                              &check4.
                               super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,
                              (vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)
                              local_c80);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_ee8,&local_ee9,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_ee8);
  if (!bVar2) {
    testing::Message::Message(&local_ef8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&swap_4.qubits_,(internal *)local_ee8,(AssertionResult *)"vec4 == check4",
               "false","true",(char *)in_R9._M_value);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_f00,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0x9c,pcVar3);
    testing::internal::AssertHelper::operator=(&local_f00,&local_ef8);
    testing::internal::AssertHelper::~AssertHelper(&local_f00);
    std::__cxx11::string::~string((string *)&swap_4.qubits_);
    testing::Message::~Message(&local_ef8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_ee8);
  std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::~vector
            ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)local_c80);
  std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::~vector
            ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)
             &check4.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::~vector
            ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)local_b08);
  std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::~vector
            ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)
             &check3.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::~vector
            ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)local_a50);
  std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::~vector
            ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)
             &check2.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  qclab::qgates::SWAP<std::complex<float>_>::~SWAP
            ((SWAP<std::complex<float>_> *)
             &vec2.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  qclab::qgates::SWAP<std::complex<float>_>::SWAP
            ((SWAP<std::complex<float>_> *)
             &vec3_1.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,0,2);
  std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::vector
            ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)
             &check3_1.
              super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage,
             (vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)local_c8);
  qclab::qgates::SWAP<std::complex<float>_>::apply
            ((SWAP<std::complex<float>_> *)
             &vec3_1.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,NoTrans,3,
             (vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)
             &check3_1.
              super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage,0);
  local_f88 = 0x40e00000;
  uStack_f80 = 0x40400000;
  local_f98 = 0x40a00000;
  uStack_f90 = 0x3f800000;
  local_fa8 = 0x40000000;
  uStack_fa0 = 0x41000000;
  local_fb8._M_value = 0x40400000;
  uStack_fb0 = 0x40800000;
  local_f70 = &local_fb8;
  local_f68 = 8;
  paVar1 = (allocator<std::complex<float>_> *)
           ((long)&gtest_ar__15.message_._M_t.
                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           + 7);
  std::allocator<std::complex<float>_>::allocator(paVar1);
  __l._M_len = local_f68;
  __l._M_array = local_f70;
  std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::vector
            ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)local_f60,__l,
             paVar1);
  std::allocator<std::complex<float>_>::~allocator
            ((allocator<std::complex<float>_> *)
             ((long)&gtest_ar__15.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  local_fd1 = std::operator==((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)
                              &check3_1.
                               super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,
                              (vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)
                              local_f60);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_fd0,&local_fd1,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_fd0);
  if (!bVar2) {
    testing::Message::Message(&local_fe0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&swap_5.qubits_,(internal *)local_fd0,(AssertionResult *)"vec3 == check3",
               "false","true",(char *)in_R9._M_value);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_fe8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0xac,pcVar3);
    testing::internal::AssertHelper::operator=(&local_fe8,&local_fe0);
    testing::internal::AssertHelper::~AssertHelper(&local_fe8);
    std::__cxx11::string::~string((string *)&swap_5.qubits_);
    testing::Message::~Message(&local_fe0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_fd0);
  std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::~vector
            ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)local_f60);
  std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::~vector
            ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)
             &check3_1.
              super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage);
  qclab::qgates::SWAP<std::complex<float>_>::~SWAP
            ((SWAP<std::complex<float>_> *)
             &vec3_1.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  qclab::qgates::SWAP<std::complex<float>_>::SWAP((SWAP<std::complex<float>_> *)&mat2.data_,0,1);
  qclab::dense::SquareMatrix<std::complex<float>_>::SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)&gtest_ar__16.message_,
             (SquareMatrix<std::complex<float>_> *)local_28);
  cVar5._M_value = (_ComplexT)&gtest_ar__16.message_;
  cVar8._M_value = 0;
  qclab::qgates::SWAP<std::complex<float>_>::apply
            ((SWAP<std::complex<float>_> *)&mat2.data_,Left,NoTrans,2,
             (SquareMatrix<std::complex<float>_> *)cVar5._M_value,0);
  qclab::qgates::SWAP<std::complex<float>_>::matrix((SWAP<std::complex<float>_> *)&local_1050);
  local_1039[0] =
       qclab::dense::SquareMatrix<std::complex<float>_>::operator==
                 ((SquareMatrix<std::complex<float>_> *)&gtest_ar__16.message_,&local_1050);
  cVar7._M_value = (_ComplexT)local_1039;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)(local_1039 + 1),(bool *)cVar7._M_value,(type *)0x0);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix(&local_1050);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)(local_1039 + 1));
  if (!bVar2) {
    testing::Message::Message(&local_1058);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&mat.data_,(internal *)(local_1039 + 1),
               (AssertionResult *)"mat2 == swap.matrix()","false","true",(char *)cVar8._M_value);
    cVar5._M_value = std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1060,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0xbb,(char *)cVar5._M_value);
    cVar7._M_value = (_ComplexT)&local_1058;
    testing::internal::AssertHelper::operator=(&local_1060,(Message *)cVar7._M_value);
    testing::internal::AssertHelper::~AssertHelper(&local_1060);
    std::__cxx11::string::~string((string *)&mat.data_);
    testing::Message::~Message(&local_1058);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)(local_1039 + 1));
  std::complex<float>::complex(&local_1098,1.0,0.0);
  std::complex<float>::complex(&local_10a0,2.0,0.0);
  std::complex<float>::complex(&local_10a8,3.0,0.0);
  std::complex<float>::complex(&local_10b0,4.0,0.0);
  std::complex<float>::complex(&local_10b8,5.0,0.0);
  std::complex<float>::complex(&local_10c0,6.0,0.0);
  std::complex<float>::complex(&local_10c8,7.0,0.0);
  std::complex<float>::complex(&local_10d0,8.0,0.0);
  std::complex<float>::complex(&local_10d8,9.0,0.0);
  std::complex<float>::complex(&local_10e0,10.0,0.0);
  std::complex<float>::complex(&local_10e8,11.0,0.0);
  std::complex<float>::complex(&local_10f0,12.0,0.0);
  std::complex<float>::complex(&local_10f8,13.0,0.0);
  std::complex<float>::complex(&local_1100,14.0,0.0);
  std::complex<float>::complex(&local_1108,15.0,0.0);
  std::complex<float>::complex((complex<float> *)&gtest_ar__17.message_,16.0,0.0);
  m31._M_value._7_1_ = in_stack_ffffffffffffeb4f;
  m31._M_value._0_7_ = in_stack_ffffffffffffeb48;
  qclab::dense::SquareMatrix<std::complex<float>_>::SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)local_1090,cVar7,m01_00,local_10d8,cVar5,cVar8,
             local_10d8,local_10e0,local_10e8,local_10f0,local_10f8,local_1100,local_1108,
             (complex<float>)
             gtest_ar__17.message_._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl,m31,in_stack_ffffffffffffeb50,in_stack_ffffffffffffeb58);
  qclab::dense::SquareMatrix<std::complex<float>_>::operator=
            ((SquareMatrix<std::complex<float>_> *)&gtest_ar__16.message_,
             (SquareMatrix<std::complex<float>_> *)local_1090);
  pcVar3 = (char *)0x0;
  qclab::qgates::SWAP<std::complex<float>_>::apply
            ((SWAP<std::complex<float>_> *)&mat2.data_,Left,NoTrans,2,
             (SquareMatrix<std::complex<float>_> *)&gtest_ar__16.message_,0);
  qclab::dense::SquareMatrix<std::complex<float>_>::SquareMatrix
            (&local_1148,(SquareMatrix<std::complex<float>_> *)local_1090);
  qclab::qgates::SWAP<std::complex<float>_>::matrix((SWAP<std::complex<float>_> *)&local_1158);
  qclab::dense::operator*((dense *)&local_1138,&local_1148,&local_1158);
  local_1121 = qclab::dense::SquareMatrix<std::complex<float>_>::operator==
                         ((SquareMatrix<std::complex<float>_> *)&gtest_ar__16.message_,&local_1138);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1120,&local_1121,(type *)0x0);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix(&local_1138);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix(&local_1158);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix(&local_1148);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1120);
  if (!bVar2) {
    testing::Message::Message(&local_1160);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__18.message_,(internal *)local_1120,
               (AssertionResult *)"mat2 == mat * swap.matrix()","false","true",pcVar3);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1168,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0xc4,pcVar3);
    testing::internal::AssertHelper::operator=(&local_1168,&local_1160);
    testing::internal::AssertHelper::~AssertHelper(&local_1168);
    std::__cxx11::string::~string((string *)&gtest_ar__18.message_);
    testing::Message::~Message(&local_1160);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1120);
  qclab::dense::SquareMatrix<std::complex<float>_>::operator=
            ((SquareMatrix<std::complex<float>_> *)&gtest_ar__16.message_,
             (SquareMatrix<std::complex<float>_> *)local_1090);
  pcVar3 = (char *)0x0;
  qclab::qgates::SWAP<std::complex<float>_>::apply
            ((SWAP<std::complex<float>_> *)&mat2.data_,Right,NoTrans,2,
             (SquareMatrix<std::complex<float>_> *)&gtest_ar__16.message_,0);
  qclab::qgates::SWAP<std::complex<float>_>::matrix((SWAP<std::complex<float>_> *)&local_11c0);
  qclab::dense::operator*
            ((dense *)&local_11b0,&local_11c0,(SquareMatrix<std::complex<float>_> *)local_1090);
  local_1199 = qclab::dense::SquareMatrix<std::complex<float>_>::operator==
                         ((SquareMatrix<std::complex<float>_> *)&gtest_ar__16.message_,&local_11b0);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1198,&local_1199,(type *)0x0);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix(&local_11b0);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix(&local_11c0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1198);
  if (!bVar2) {
    testing::Message::Message(&local_11c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&mat3.data_,(internal *)local_1198,
               (AssertionResult *)"mat2 == swap.matrix() * mat","false","true",pcVar3);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_11d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,200,pcVar3);
    testing::internal::AssertHelper::operator=(&local_11d0,&local_11c8);
    testing::internal::AssertHelper::~AssertHelper(&local_11d0);
    std::__cxx11::string::~string((string *)&mat3.data_);
    testing::Message::~Message(&local_11c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1198);
  qclab::dense::SquareMatrix<std::complex<float>_>::SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)&gtest_ar__19.message_,
             (SquareMatrix<std::complex<float>_> *)&I4.data_);
  pcVar3 = (char *)0x0;
  qclab::qgates::SWAP<std::complex<float>_>::apply
            ((SWAP<std::complex<float>_> *)&mat2.data_,Left,NoTrans,3,
             (SquareMatrix<std::complex<float>_> *)&gtest_ar__19.message_,0);
  qclab::qgates::SWAP<std::complex<float>_>::matrix((SWAP<std::complex<float>_> *)&local_1238);
  qclab::dense::kron<std::complex<float>>
            ((dense *)&local_1228,&local_1238,(SquareMatrix<std::complex<float>_> *)&I2.data_);
  local_1211 = qclab::dense::SquareMatrix<std::complex<float>_>::operator==
                         ((SquareMatrix<std::complex<float>_> *)&gtest_ar__19.message_,&local_1228);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1210,&local_1211,(type *)0x0);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix(&local_1228);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix(&local_1238);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1210);
  if (!bVar2) {
    testing::Message::Message(&local_1240);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)qnew_2,(internal *)local_1210,
               (AssertionResult *)"mat3 == qclab::dense::kron( swap.matrix() , I1 )","false","true",
               pcVar3);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1248,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0xcd,pcVar3);
    testing::internal::AssertHelper::operator=(&local_1248,&local_1240);
    testing::internal::AssertHelper::~AssertHelper(&local_1248);
    std::__cxx11::string::~string((string *)qnew_2);
    testing::Message::~Message(&local_1240);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1210);
  gtest_ar__20.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x200000001;
  qclab::qgates::SWAP<std::complex<float>_>::setQubits
            ((SWAP<std::complex<float>_> *)&mat2.data_,(int *)&gtest_ar__20.message_);
  qclab::dense::SquareMatrix<std::complex<float>_>::operator=
            ((SquareMatrix<std::complex<float>_> *)&gtest_ar__19.message_,
             (SquareMatrix<std::complex<float>_> *)&I4.data_);
  pcVar3 = (char *)0x0;
  qclab::qgates::SWAP<std::complex<float>_>::apply
            ((SWAP<std::complex<float>_> *)&mat2.data_,Left,NoTrans,3,
             (SquareMatrix<std::complex<float>_> *)&gtest_ar__19.message_,0);
  qclab::qgates::SWAP<std::complex<float>_>::matrix((SWAP<std::complex<float>_> *)&local_12a8);
  qclab::dense::kron<std::complex<float>>
            ((dense *)&local_1298,(SquareMatrix<std::complex<float>_> *)&I2.data_,&local_12a8);
  local_1281 = qclab::dense::SquareMatrix<std::complex<float>_>::operator==
                         ((SquareMatrix<std::complex<float>_> *)&gtest_ar__19.message_,&local_1298);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1280,&local_1281,(type *)0x0);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix(&local_1298);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix(&local_12a8);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1280);
  if (!bVar2) {
    testing::Message::Message(&local_12b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&swap_6.qubits_,(internal *)local_1280,
               (AssertionResult *)"mat3 == qclab::dense::kron( I1 , swap.matrix() )","false","true",
               pcVar3);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_12b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0xd3,pcVar3);
    testing::internal::AssertHelper::operator=(&local_12b8,&local_12b0);
    testing::internal::AssertHelper::~AssertHelper(&local_12b8);
    std::__cxx11::string::~string((string *)&swap_6.qubits_);
    testing::Message::~Message(&local_12b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1280);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)&gtest_ar__19.message_);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)local_1090);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)&gtest_ar__16.message_);
  qclab::qgates::SWAP<std::complex<float>_>::~SWAP((SWAP<std::complex<float>_> *)&mat2.data_);
  qclab::qgates::SWAP<std::complex<float>_>::SWAP((SWAP<std::complex<float>_> *)&check.data_,0,2);
  qclab::dense::zeros<std::complex<float>>((dense *)&mat3_1.data_,8);
  pcVar6 = qclab::dense::SquareMatrix<std::complex<float>_>::operator()
                     ((SquareMatrix<std::complex<float>_> *)&mat3_1.data_,0,0);
  std::complex<float>::operator=(pcVar6,1.0);
  pcVar6 = qclab::dense::SquareMatrix<std::complex<float>_>::operator()
                     ((SquareMatrix<std::complex<float>_> *)&mat3_1.data_,4,1);
  std::complex<float>::operator=(pcVar6,1.0);
  pcVar6 = qclab::dense::SquareMatrix<std::complex<float>_>::operator()
                     ((SquareMatrix<std::complex<float>_> *)&mat3_1.data_,2,2);
  std::complex<float>::operator=(pcVar6,1.0);
  pcVar6 = qclab::dense::SquareMatrix<std::complex<float>_>::operator()
                     ((SquareMatrix<std::complex<float>_> *)&mat3_1.data_,6,3);
  std::complex<float>::operator=(pcVar6,1.0);
  pcVar6 = qclab::dense::SquareMatrix<std::complex<float>_>::operator()
                     ((SquareMatrix<std::complex<float>_> *)&mat3_1.data_,1,4);
  std::complex<float>::operator=(pcVar6,1.0);
  pcVar6 = qclab::dense::SquareMatrix<std::complex<float>_>::operator()
                     ((SquareMatrix<std::complex<float>_> *)&mat3_1.data_,5,5);
  std::complex<float>::operator=(pcVar6,1.0);
  pcVar6 = qclab::dense::SquareMatrix<std::complex<float>_>::operator()
                     ((SquareMatrix<std::complex<float>_> *)&mat3_1.data_,3,6);
  std::complex<float>::operator=(pcVar6,1.0);
  pcVar6 = qclab::dense::SquareMatrix<std::complex<float>_>::operator()
                     ((SquareMatrix<std::complex<float>_> *)&mat3_1.data_,7,7);
  std::complex<float>::operator=(pcVar6,1.0);
  qclab::dense::SquareMatrix<std::complex<float>_>::SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)&gtest_ar__21.message_,
             (SquareMatrix<std::complex<float>_> *)&I4.data_);
  pcVar3 = (char *)0x0;
  qclab::qgates::SWAP<std::complex<float>_>::apply
            ((SWAP<std::complex<float>_> *)&check.data_,Left,NoTrans,3,
             (SquareMatrix<std::complex<float>_> *)&gtest_ar__21.message_,0);
  local_1319 = qclab::dense::SquareMatrix<std::complex<float>_>::operator==
                         ((SquareMatrix<std::complex<float>_> *)&gtest_ar__21.message_,
                          (SquareMatrix<std::complex<float>_> *)&mat3_1.data_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1318,&local_1319,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1318);
  if (!bVar2) {
    testing::Message::Message(&local_1328);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1350,(internal *)local_1318,(AssertionResult *)"mat3 == check","false","true",
               pcVar3);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1330,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/SWAP.cpp"
               ,0xe6,pcVar3);
    testing::internal::AssertHelper::operator=(&local_1330,&local_1328);
    testing::internal::AssertHelper::~AssertHelper(&local_1330);
    std::__cxx11::string::~string((string *)&local_1350);
    testing::Message::~Message(&local_1328);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1318);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)&gtest_ar__21.message_);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)&mat3_1.data_);
  qclab::qgates::SWAP<std::complex<float>_>::~SWAP((SWAP<std::complex<float>_> *)&check.data_);
  std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::~vector
            ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)local_138);
  std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::~vector
            ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)local_c8);
  std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::~vector
            ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)local_70);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)
             &v2.super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)&I4.data_);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)local_28);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)&I2.data_);
  return;
}

Assistant:

void test_qclab_qgates_SWAP() {

  const auto I1 = qclab::dense::eye< T >(  2 ) ;
  const auto I2 = qclab::dense::eye< T >(  4 ) ;
  const auto I3 = qclab::dense::eye< T >(  8 ) ;
  const auto I4 = qclab::dense::eye< T >( 16 ) ;

  using V = std::vector< T > ;
  const V v2 = { 3 , 5 , 2 , 7 } ;
  const V v3 = { 3 , 5 , 2 , 7 , 4 , 1 , 8 , 3 } ;
  const V v4 = { 3 , 5 , 2 , 7 , 4 , 1 , 8 , 3 , 7 , 2 , 5 , 6 , 8 , 9 , 5 , 1};

  {
    qclab::qgates::SWAP< T >  swap ;

    EXPECT_EQ( swap.nbQubits() , 2 ) ;   // nbQubits
    EXPECT_TRUE( swap.fixed() ) ;        // fixed
    EXPECT_FALSE( swap.controlled() ) ;  // controlled

    // qubit
    EXPECT_EQ( swap.qubit() , 0 ) ;

    // qubits
    auto qubits = swap.qubits() ;
    EXPECT_EQ( qubits.size() , 2 ) ;
    EXPECT_EQ( qubits[0] , 0 ) ;
    EXPECT_EQ( qubits[1] , 1 ) ;
    int qnew[] = { 3 , 5 } ;
    swap.setQubits( &qnew[0] ) ;
    EXPECT_EQ( swap.qubits()[0] , 3 ) ;
    EXPECT_EQ( swap.qubits()[1] , 5 ) ;
    qnew[0] = 0 ;
    qnew[1] = 1 ;
    swap.setQubits( &qnew[0] ) ;

    // matrix
    qclab::dense::SquareMatrix< T >  SWAP_check( 1 , 0 , 0 , 0 ,
                                                 0 , 0 , 1 , 0 ,
                                                 0 , 1 , 0 , 0 ,
                                                 0 , 0 , 0 , 1 ) ;
    EXPECT_TRUE( swap.matrix() == SWAP_check ) ;

    // print
    swap.print() ;

    // toQASM
    std::stringstream qasm ;
    EXPECT_EQ( swap.toQASM( qasm ) , 0 ) ;
    EXPECT_EQ( qasm.str() , "swap q[0], q[1];\n" ) ;
    std::cout << qasm.str() ;

    // operators == and !=
    qclab::qgates::SWAP< T >  swap2( 2 , 4 ) ;
    EXPECT_TRUE(  swap == swap2 ) ;
    EXPECT_FALSE( swap != swap2 ) ;
  }

  {
    qclab::qgates::SWAP< T >  swap( 3 , 5 ) ;

    EXPECT_EQ( swap.nbQubits() , 2 ) ;   // nbQubits
    EXPECT_TRUE( swap.fixed() ) ;        // fixed
    EXPECT_FALSE( swap.controlled() ) ;  // controlled
    EXPECT_EQ( swap.qubits()[0] , 3 ) ;  // qubit0
    EXPECT_EQ( swap.qubits()[1] , 5 ) ;  // qubit1
  }

  {
    int qubits[] = { 3 , 5 } ;
    qclab::qgates::SWAP< T >  swap( &qubits[0] ) ;

    EXPECT_EQ( swap.nbQubits() , 2 ) ;   // nbQubits
    EXPECT_TRUE( swap.fixed() ) ;        // fixed
    EXPECT_FALSE( swap.controlled() ) ;  // controlled
    EXPECT_EQ( swap.qubits()[0] , 3 ) ;  // qubit0
    EXPECT_EQ( swap.qubits()[1] , 5 ) ;  // qubit1
  }

  {
    qclab::qgates::SWAP< T >  swap( 0 , 1 ) ;

    // apply (2 qubits)
    auto vec2 = v2 ;
    swap.apply( qclab::Op::NoTrans , 2 , vec2 ) ;
    V check2 = { 3 , 2 , 5 , 7 } ;
    EXPECT_TRUE( vec2 == check2 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec2 = v2 ; T* vec2_ = vec2.data() ;
    #pragma omp target data map(tofrom:vec2_[0:4])
    { swap.apply_device( qclab::Op::NoTrans , 2 , vec2_ ) ; }
    EXPECT_TRUE( vec2 == check2 ) ;
  #endif

    // apply (3 qubits)
    auto vec3 = v3 ;
    swap.apply( qclab::Op::NoTrans , 3 , vec3 ) ;
    V check3 = { 3 , 5 , 4 , 1 , 2 , 7 , 8 , 3 } ;
    EXPECT_TRUE( vec3 == check3 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec3 = v3 ; T* vec3_ = vec3.data() ;
    #pragma omp target data map(tofrom:vec3_[0:8])
    { swap.apply_device( qclab::Op::NoTrans , 3 , vec3_ ) ; }
    EXPECT_TRUE( vec3 == check3 ) ;
  #endif

    int qnew[] = { 1 , 2 } ;
    swap.setQubits( &qnew[0] ) ;
    vec3 = v3 ;
    swap.apply( qclab::Op::NoTrans , 3 , vec3 ) ;
    check3 = { 3 , 2 , 5 , 7 , 4 , 8 , 1 , 3 } ;
    EXPECT_TRUE( vec3 == check3 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec3 = v3 ;
    #pragma omp target data map(tofrom:vec3_[0:8])
    { swap.apply_device( qclab::Op::NoTrans , 3 , vec3_ ) ; }
    EXPECT_TRUE( vec3 == check3 ) ;
  #endif

    // apply (4 qubits)
    auto vec4 = v4 ;
    swap.apply( qclab::Op::NoTrans , 4 , vec4 ) ;
    V check4 = { 3 , 5 , 4 , 1 , 2 , 7 , 8 , 3 , 7 , 2 , 8 , 9 , 5 , 6 , 5 , 1};
    EXPECT_TRUE( vec4 == check4 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec4 = v4 ; T* vec4_ = vec4.data() ;
    #pragma omp target data map(tofrom:vec4_[0:16])
    { swap.apply_device( qclab::Op::NoTrans , 4 , vec4_ ) ; }
    EXPECT_TRUE( vec4 == check4 ) ;
  #endif

    qnew[0] = 0 ;
    qnew[1] = 1 ;
    swap.setQubits( &qnew[0] ) ;
    vec4 = v4 ;
    swap.apply( qclab::Op::NoTrans , 4 , vec4 ) ;
    check4 = { 3 , 5 , 2 , 7 , 7 , 2 , 5 , 6 , 4 , 1 , 8 , 3 , 8 , 9 , 5 , 1 } ;
    EXPECT_TRUE( vec4 == check4 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec4 = v4 ;
    #pragma omp target data map(tofrom:vec4_[0:16])
    { swap.apply_device( qclab::Op::NoTrans , 4 , vec4_ ) ; }
    EXPECT_TRUE( vec4 == check4 ) ;
  #endif

    qnew[0] = 2 ;
    qnew[1] = 3 ;
    swap.setQubits( &qnew[0] ) ;
    vec4 = v4 ;
    swap.apply( qclab::Op::NoTrans , 4 , vec4 ) ;
    check4 = { 3 , 2 , 5 , 7 , 4 , 8 , 1 , 3 , 7 , 5 , 2 , 6 , 8 , 5 , 9 , 1 } ;
    EXPECT_TRUE( vec4 == check4 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec4 = v4 ;
    #pragma omp target data map(tofrom:vec4_[0:16])
    { swap.apply_device( qclab::Op::NoTrans , 4 , vec4_ ) ; }
    EXPECT_TRUE( vec4 == check4 ) ;
  #endif
  }

  {
    qclab::qgates::SWAP< T >  swap( 0 , 2 ) ;

    // apply (3 qubits)
    auto vec3 = v3 ;
    swap.apply( qclab::Op::NoTrans , 3 , vec3 ) ;
    V check3 = { 3 , 4 , 2 , 8 , 5 , 1 , 7 , 3 } ;
    EXPECT_TRUE( vec3 == check3 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec3 = v3 ; T* vec3_ = vec3.data() ;
    #pragma omp target data map(tofrom:vec3_[0:8])
    { swap.apply_device( qclab::Op::NoTrans , 3 , vec3_ ) ; }
    EXPECT_TRUE( vec3 == check3 ) ;
  #endif
  }

  {
    qclab::qgates::SWAP< T >  swap( 0 , 1 ) ;

    // apply (2 qubits)
    auto mat2 = I2 ;
    swap.apply( qclab::Side::Left , qclab::Op::NoTrans , 2 , mat2 ) ;
    EXPECT_TRUE( mat2 == swap.matrix() ) ;

    qclab::dense::SquareMatrix< T >  mat(  1 ,  2 ,  3 ,  4 ,
                                           5 ,  6 ,  7 ,  8 ,
                                           9 , 10 , 11 , 12 ,
                                          13 , 14 , 15 , 16 ) ;

    mat2 = mat ;
    swap.apply( qclab::Side::Left , qclab::Op::NoTrans , 2 , mat2 ) ;
    EXPECT_TRUE( mat2 == mat * swap.matrix() ) ;

    mat2 = mat ;
    swap.apply( qclab::Side::Right , qclab::Op::NoTrans , 2 , mat2 ) ;
    EXPECT_TRUE( mat2 == swap.matrix() * mat ) ;

    // apply (3 qubits)
    auto mat3 = I3 ;
    swap.apply( qclab::Side::Left , qclab::Op::NoTrans , 3 , mat3 ) ;
    EXPECT_TRUE( mat3 == qclab::dense::kron( swap.matrix() , I1 ) ) ;

    int qnew[] = { 1 , 2 } ;
    swap.setQubits( &qnew[0] ) ;
    mat3 = I3 ;
    swap.apply( qclab::Side::Left , qclab::Op::NoTrans , 3 , mat3 ) ;
    EXPECT_TRUE( mat3 == qclab::dense::kron( I1 , swap.matrix() ) ) ;
  }

  {
    qclab::qgates::SWAP< T >  swap( 0 , 2 ) ;

    auto check = qclab::dense::zeros< T >( 8 ) ;
    check(0,0) = 1 ;
    check(4,1) = 1 ;
    check(2,2) = 1 ;
    check(6,3) = 1 ;
    check(1,4) = 1 ;
    check(5,5) = 1 ;
    check(3,6) = 1 ;
    check(7,7) = 1 ;

    // apply (3 qubits)
    auto mat3 = I3 ;
    swap.apply( qclab::Side::Left , qclab::Op::NoTrans , 3 , mat3 ) ;
    EXPECT_TRUE( mat3 == check ) ;
  }

}